

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# View.cpp
# Opt level: O1

void __thiscall sf::View::View(View *this,Vector2f *center,Vector2f *size)

{
  this->m_center = *center;
  this->m_size = *size;
  this->m_rotation = 0.0;
  (this->m_viewport).left = 0.0;
  (this->m_viewport).top = 0.0;
  (this->m_viewport).width = 1.0;
  (this->m_viewport).height = 1.0;
  Transform::Transform(&this->m_transform);
  Transform::Transform(&this->m_inverseTransform);
  this->m_transformUpdated = false;
  this->m_invTransformUpdated = false;
  return;
}

Assistant:

View::View(const Vector2f& center, const Vector2f& size) :
m_center             (center),
m_size               (size),
m_rotation           (0),
m_viewport           (0, 0, 1, 1),
m_transformUpdated   (false),
m_invTransformUpdated(false)
{

}